

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

void __thiscall METADemuxer::openFile(METADemuxer *this,string *streamName)

{
  int iVar1;
  pointer pSVar2;
  AbstractStreamReader *pAVar3;
  bool bVar4;
  bool bVar5;
  mapped_type *this_00;
  long lVar6;
  pointer pSVar7;
  ostream *poVar8;
  undefined4 *puVar9;
  ulong uVar10;
  iterator __begin2;
  pointer pSVar11;
  allocator<char> local_2b9;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  uint *local_260;
  undefined8 local_258;
  uint local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  string local_240;
  string codecStreamName;
  string codec;
  TextFile file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  addParams;
  
  std::__cxx11::string::_M_assign((string *)&this->m_streamName);
  readClose(this);
  TextFile::TextFile(&file,(this->m_streamName)._M_dataplus._M_p,1,0);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  TextFile::readLine(&file,&str);
  while( true ) {
    if (str._M_string_length == 0) break;
    trimStr((string *)&addParams,&str);
    std::__cxx11::string::operator=((string *)&str,(string *)&addParams);
    std::__cxx11::string::~string((string *)&addParams);
    if ((str._M_string_length == 0) || (*str._M_dataplus._M_p == '#')) {
LAB_001b1d58:
      TextFile::readLine(&file,&str);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&addParams,"MUXOPT",(allocator<char> *)&codec);
      bVar5 = strStartWith(&str,(string *)&addParams);
      std::__cxx11::string::~string((string *)&addParams);
      if (bVar5) goto LAB_001b1d58;
      splitQuotedStr_abi_cxx11_(&params,str._M_dataplus._M_p,',');
      if ((ulong)((long)params.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)params.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&addParams);
        poVar8 = std::operator<<((ostream *)&addParams,"Invalid codec format: ");
        std::operator<<(poVar8,(string *)&str);
        puVar9 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar9 = 0x1f6;
        *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
        if (local_260 == &local_250) {
          puVar9[6] = local_250;
          puVar9[7] = uStack_24c;
          puVar9[8] = uStack_248;
          puVar9[9] = uStack_244;
        }
        else {
          *(uint **)(puVar9 + 2) = local_260;
          *(ulong *)(puVar9 + 6) = CONCAT44(uStack_24c,local_250);
        }
        *(undefined8 *)(puVar9 + 4) = local_258;
        local_250 = local_250 & 0xffffff00;
        __cxa_throw(puVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      addParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      addParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      addParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &addParams._M_t._M_impl.super__Rb_tree_header._M_header;
      addParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      addParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           addParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (uVar10 = 2;
          uVar10 < (ulong)((long)params.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)params.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar10 = (ulong)((int)uVar10 + 1)) {
        splitStr_abi_cxx11_(&tmp,params.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p,
                            '=');
        if ((ulong)((long)tmp.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)tmp.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&codecStreamName,"",&local_2b9);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&codecStreamName,
                     (string *)
                     (tmp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        trimStr(&codec,&codecStreamName);
        trimStr(&local_240,
                tmp.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&addParams,&local_240);
        std::__cxx11::string::operator=((string *)this_00,(string *)&codec);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&codec);
        std::__cxx11::string::~string((string *)&codecStreamName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&tmp);
      }
      trimStr(&codec,params.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      trimStr(&codecStreamName,
              params.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1);
      strToUpperCase(&local_240,&codec);
      std::__cxx11::string::operator=((string *)&codec,(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      if (this->m_HevcFound == false) {
        lVar6 = std::__cxx11::string::find((char *)&codec,0x2031b4);
        this->m_HevcFound = lVar6 == 0xc;
      }
      addStream(this,&codec,&codecStreamName,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&addParams._M_t);
      TextFile::readLine(&file,&str);
      std::__cxx11::string::~string((string *)&codecStreamName);
      std::__cxx11::string::~string((string *)&codec);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&addParams._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&params);
    }
  }
  pSVar11 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar7 = pSVar11;
  do {
    if (pSVar7 == pSVar2) {
LAB_001b1fb5:
      std::__cxx11::string::~string((string *)&str);
      File::~File(&file.super_File);
      return;
    }
    pAVar3 = pSVar7->m_streamReader;
    if (((pAVar3 != (AbstractStreamReader *)0x0) &&
        ((pAVar3->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader ==
         (_func_int **)&PTR__H264StreamReader_0024a7a0)) &&
       (*(char *)((long)&pAVar3[5].m_tmpBufferLen + 2) != '\x01')) {
      iVar1 = *(int *)((long)&pAVar3[3].m_buffer + 4);
      if (iVar1 != 3) {
        bVar5 = false;
        for (; pSVar11 != pSVar2; pSVar11 = pSVar11 + 1) {
          pAVar3 = pSVar11->m_streamReader;
          if (((pAVar3 != (AbstractStreamReader *)0x0) &&
              ((pAVar3->super_BaseAbstractStreamReader)._vptr_BaseAbstractStreamReader ==
               (_func_int **)&PTR__H264StreamReader_0024a7a0)) &&
             (*(char *)((long)&pAVar3[5].m_tmpBufferLen + 2) == '\x01')) {
            bVar4 = !bVar5;
            bVar5 = true;
            if (bVar4) {
              if (*(int *)((long)&pAVar3[3].m_buffer + 4) == iVar1) {
                bVar5 = false;
              }
              else {
                poVar8 = std::operator<<((ostream *)&std::cout,
                                         "Parameter \'insertSEI\' for MVC dependent view differs from same param for AVC base view. Ignore and apply same value"
                                        );
                std::endl<char,std::char_traits<char>>(poVar8);
                sLastMsg = true;
              }
            }
            *(int *)((long)&pAVar3[3].m_buffer + 4) = iVar1;
          }
        }
      }
      goto LAB_001b1fb5;
    }
    pSVar7 = pSVar7 + 1;
  } while( true );
}

Assistant:

void METADemuxer::openFile(const string& streamName)
{
    m_streamName = streamName;
    readClose();

    TextFile file(m_streamName.c_str(), File::ofRead);
    string str;
    file.readLine(str);
    while (str.length() > 0)
    {
        str = trimStr(str);
        if (str.length() == 0 || str[0] == '#')
        {
            file.readLine(str);
            continue;
        }
        if (strStartWith(str, "MUXOPT"))
        {
            file.readLine(str);
            continue;
        }
        vector<string> params = splitQuotedStr(str.c_str(), ',');
        if (params.size() < 2)
            THROW(ERR_INVALID_CODEC_FORMAT, "Invalid codec format: " << str)
        map<string, string> addParams;
        for (unsigned i = 2; i < params.size(); i++)
        {
            // params[i] = strToLowerCase ( params[i] );
            vector<string> tmp = splitStr(params[i].c_str(), '=');
            addParams[trimStr(tmp[0])] = trimStr(tmp.size() > 1 ? tmp[1] : "");
        }
        string codec = trimStr(params[0]);
        string codecStreamName = trimStr(params[1]);
        codec = strToUpperCase(codec);
        if (!m_HevcFound)
            m_HevcFound = (codec.find("HEVC") == 12);
        addStream(codec, codecStreamName, addParams);
        file.readLine(str);
    }

    auto primarySEI = H264StreamReader::SeiMethod::SEI_NotDefined;
    for (const auto& si : m_codecInfo)
    {
        const auto reader = dynamic_cast<H264StreamReader*>(si.m_streamReader);
        if (reader && !reader->isSubStream())
        {
            primarySEI = reader->getInsertSEI();
            break;
        }
    }

    if (primarySEI != H264StreamReader::SeiMethod::SEI_NotDefined)
    {
        bool warned = false;
        for (const auto& i : m_codecInfo)
        {
            const auto reader = dynamic_cast<H264StreamReader*>(i.m_streamReader);
            if (reader && reader->isSubStream())
            {
                if (!warned && reader->getInsertSEI() != primarySEI)
                {
                    LTRACE(LT_INFO, 2,
                           "Parameter 'insertSEI' for MVC dependent view differs from same param for AVC base view. "
                           "Ignore and apply same value");
                    warned = true;
                }
                reader->setInsertSEI(primarySEI);
            }
        }
    }
}